

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder_utf.c
# Opt level: O0

HPDF_STATUS HPDF_UseUTFEncodings(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_Encoder encoder_00;
  HPDF_STATUS ret;
  HPDF_Encoder encoder;
  HPDF_Doc pdf_local;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    pdf_local = (HPDF_Doc)0x1025;
  }
  else {
    encoder_00 = HPDF_CMapEncoder_New(pdf->mmgr,"UTF-8",UTF8_Init);
    pdf_local = (HPDF_Doc)HPDF_Doc_RegisterEncoder(pdf,encoder_00);
    if (pdf_local == (HPDF_Doc)0x0) {
      pdf_local = (HPDF_Doc)0x0;
    }
  }
  return (HPDF_STATUS)pdf_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_UseUTFEncodings   (HPDF_Doc   pdf)
{
    HPDF_Encoder encoder;
    HPDF_STATUS ret;

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    encoder = HPDF_CMapEncoder_New (pdf->mmgr,  "UTF-8",
                UTF8_Init);

    if ((ret = HPDF_Doc_RegisterEncoder (pdf, encoder)) != HPDF_OK)
        return ret;

    return HPDF_OK;
}